

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O0

void Cba_BlastConst(Cba_Ntk_t *p,Vec_Int_t *vOut,int iFon,int nTotal,int fSigned)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  int Fill;
  size_t sVar4;
  int nBits;
  int Number;
  int i;
  char *pLimit;
  char *pConst;
  int fSigned_local;
  int nTotal_local;
  int iFon_local;
  Vec_Int_t *vOut_local;
  Cba_Ntk_t *p_local;
  
  iVar3 = Cba_FonConst(iFon);
  pLimit = Cba_NtkConst(p,iVar3);
  sVar4 = strlen(pLimit);
  _Number = pLimit + sVar4;
  iVar3 = atoi(pLimit);
  if (nTotal < iVar3) {
    __assert_fail("nBits <= nTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                  ,0x52,"void Cba_BlastConst(Cba_Ntk_t *, Vec_Int_t *, int, int, int)");
  }
  while( true ) {
    bVar1 = false;
    if ('/' < *pLimit) {
      bVar1 = *pLimit < ':';
    }
    if (!bVar1) break;
    pLimit = pLimit + 1;
  }
  if (*pLimit == '\'') {
    pcVar2 = pLimit + 1;
    if (pLimit[1] == 's') {
      pcVar2 = pLimit + 2;
    }
    pLimit = pcVar2;
    Vec_IntClear(vOut);
    if (*pLimit == 'b') {
      while (_Number = _Number + -1, pLimit < _Number) {
        Vec_IntPush(vOut,(uint)(*_Number != '0'));
      }
    }
    else if (*pLimit == 'h') {
      while (_Number = _Number + -1, pLimit < _Number) {
        iVar3 = Cba_ReadHexDigit(*_Number);
        for (nBits = 0; nBits < 4; nBits = nBits + 1) {
          Vec_IntPush(vOut,iVar3 >> ((byte)nBits & 0x1f) & 1);
        }
      }
      iVar3 = Vec_IntSize(vOut);
      if (nTotal < iVar3) {
        Vec_IntShrink(vOut,nTotal);
      }
    }
    else {
      if (*pLimit != 'd') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                      ,0x73,"void Cba_BlastConst(Cba_Ntk_t *, Vec_Int_t *, int, int, int)");
      }
      iVar3 = atoi(pLimit + 1);
      for (nBits = 0; nBits < 0x20; nBits = nBits + 1) {
        Vec_IntPush(vOut,iVar3 >> ((byte)nBits & 0x1f) & 1);
      }
      iVar3 = Vec_IntSize(vOut);
      if (nTotal < iVar3) {
        Vec_IntShrink(vOut,nTotal);
      }
    }
    if ((fSigned != 0) && (iVar3 = Vec_IntSize(vOut), iVar3 < nTotal)) {
      iVar3 = Vec_IntSize(vOut);
      Fill = Vec_IntEntryLast(vOut);
      Vec_IntFillExtra(vOut,nTotal - iVar3,Fill);
    }
    return;
  }
  __assert_fail("*pConst == \'\\\'\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                ,0x55,"void Cba_BlastConst(Cba_Ntk_t *, Vec_Int_t *, int, int, int)");
}

Assistant:

void Cba_BlastConst( Cba_Ntk_t * p, Vec_Int_t * vOut, int iFon, int nTotal, int fSigned )
{
    char * pConst = Cba_NtkConst(p, Cba_FonConst(iFon));
    char * pLimit = pConst + strlen(pConst);
    int i, Number, nBits = atoi( pConst );
    assert( nBits <= nTotal );
    while ( *pConst >= '0' && *pConst <= '9' )
        pConst++;
    assert( *pConst == '\'' );
    pConst++;
    if ( *pConst == 's' ) // assume signedness is already used in setting fSigned
        pConst++;
    Vec_IntClear( vOut );
    if ( *pConst == 'b' )
    {
        while ( --pLimit > pConst )
            Vec_IntPush( vOut, *pLimit == '0' ? 0 : 1 );
    }
    else if ( *pConst == 'h' )
    {
        while ( --pLimit > pConst )
        {
            Number = Cba_ReadHexDigit( *pLimit );
            for ( i = 0; i < 4; i++ )
                Vec_IntPush( vOut, (Number >> i) & 1 );
        }
        if ( Vec_IntSize(vOut) > nTotal )
            Vec_IntShrink( vOut, nTotal );
    }
    else if ( *pConst == 'd' )
    {
        Number = atoi( pConst+1 );
        assert( Number <= 0x7FFFFFFF );
        for ( i = 0; i < 32; i++ )
            Vec_IntPush( vOut, (Number >> i) & 1 );
        if ( Vec_IntSize(vOut) > nTotal )
            Vec_IntShrink( vOut, nTotal );
    }
    else assert( 0 );
    if ( fSigned && Vec_IntSize(vOut) < nTotal )
        Vec_IntFillExtra( vOut, nTotal - Vec_IntSize(vOut), Vec_IntEntryLast(vOut) );
}